

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

CPubKey * __thiscall
wallet::LegacyScriptPubKeyMan::GenerateNewKey
          (CPubKey *__return_storage_ptr__,LegacyScriptPubKeyMan *this,WalletBatch *batch,
          CHDChain *hd_chain,bool internal)

{
  long lVar1;
  WalletStorage *pWVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int64_t nCreateTime_;
  mapped_type *this_00;
  runtime_error *this_01;
  long in_FS_OFFSET;
  allocator<char> local_f9;
  CKey secret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  CKeyMetadata metadata;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar4 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,0x100000000);
  if ((char)iVar4 != '\0') {
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x43d,
                  "CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &, CHDChain &, bool)"
                 );
  }
  pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar4 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,0x200000000);
  if ((char)iVar4 == '\0') {
    pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar4 = (*pWVar2->_vptr_WalletStorage[6])(pWVar2,60000);
    secret.fCompressed = false;
    secret.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    nCreateTime_ = GetTime();
    CKeyMetadata::CKeyMetadata(&metadata,nCreateTime_);
    iVar5 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])(this);
    if ((char)iVar5 == '\0') {
      CKey::MakeNewKey(&secret,SUB41(iVar4,0));
    }
    else {
      pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      iVar5 = (*pWVar2->_vptr_WalletStorage[6])(pWVar2,0x2227c);
      DeriveNewChildKey(this,batch,&metadata,&secret,hd_chain,(bool)((byte)iVar5 & internal));
    }
    if (SUB41(iVar4,0) != false) {
      pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      (*pWVar2->_vptr_WalletStorage[7])(pWVar2,60000,0);
    }
    CKey::GetPubKey(__return_storage_ptr__,&secret);
    bVar3 = CKey::VerifyPubKey(&secret,__return_storage_ptr__);
    if (bVar3) {
      CPubKey::GetID((CKeyID *)&local_c8,__return_storage_ptr__);
      this_00 = std::
                map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,(key_type *)&local_c8);
      CKeyMetadata::operator=(this_00,&metadata);
      UpdateTimeFirstKey(this,nCreateTime_);
      bVar3 = AddKeyPubKeyWithDB(this,batch,&secret,__return_storage_ptr__);
      if (bVar3) {
        CKeyMetadata::~CKeyMetadata(&metadata);
        std::
        unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ::~unique_ptr(&secret.keydata);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return __return_storage_ptr__;
        }
      }
      else {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"GenerateNewKey",&local_f9);
        std::operator+(&local_c8,&local_e8,": AddKey failed");
        std::runtime_error::runtime_error(this_01,(string *)&local_c8);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      __stack_chk_fail();
    }
    __assert_fail("secret.VerifyPubKey(pubkey)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x455,
                  "CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &, CHDChain &, bool)"
                 );
  }
  __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET)",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                ,0x43e,
                "CPubKey wallet::LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &, CHDChain &, bool)"
               );
}

Assistant:

CPubKey LegacyScriptPubKeyMan::GenerateNewKey(WalletBatch &batch, CHDChain& hd_chain, bool internal)
{
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET));
    AssertLockHeld(cs_KeyStore);
    bool fCompressed = m_storage.CanSupportFeature(FEATURE_COMPRPUBKEY); // default to compressed public keys if we want 0.6.0 wallets

    CKey secret;

    // Create new metadata
    int64_t nCreationTime = GetTime();
    CKeyMetadata metadata(nCreationTime);

    // use HD key derivation if HD was enabled during wallet creation and a seed is present
    if (IsHDEnabled()) {
        DeriveNewChildKey(batch, metadata, secret, hd_chain, (m_storage.CanSupportFeature(FEATURE_HD_SPLIT) ? internal : false));
    } else {
        secret.MakeNewKey(fCompressed);
    }

    // Compressed public keys were introduced in version 0.6.0
    if (fCompressed) {
        m_storage.SetMinVersion(FEATURE_COMPRPUBKEY);
    }

    CPubKey pubkey = secret.GetPubKey();
    assert(secret.VerifyPubKey(pubkey));

    mapKeyMetadata[pubkey.GetID()] = metadata;
    UpdateTimeFirstKey(nCreationTime);

    if (!AddKeyPubKeyWithDB(batch, secret, pubkey)) {
        throw std::runtime_error(std::string(__func__) + ": AddKey failed");
    }
    return pubkey;
}